

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O2

JsErrorCode JsCreateArray(uint length,JsValueRef *result)

{
  ScriptContext *pSVar1;
  JsrtContext *pJVar2;
  JavascriptArray *pJVar3;
  JsErrorCode exitStatus;
  AutoNestedHandledExceptionType local_58 [2];
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  undefined1 auStack_38 [8];
  TTDRecorder _actionEntryPopper;
  
  auStack_38 = (undefined1  [8])0x0;
  _actionEntryPopper.m_actionEvent = (EventLogEntry *)0x0;
  pJVar2 = JsrtContext::GetCurrent();
  if (pJVar2 == (JsrtContext *)0x0) {
    exitStatus = JsErrorNoCurrentContext;
  }
  else {
    pSVar1 = (((pJVar2->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
    AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
              (local_58,ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
    if (pSVar1->TTDShouldPerformRecordAction == true) {
      TTD::EventLog::RecordJsRTAllocateBasicArray
                (pSVar1->threadContext->TTDLog,(TTDJsRTActionResultAutoRecorder *)auStack_38,length)
      ;
    }
    if (result == (JsValueRef *)0x0) {
      exitStatus = JsErrorNullArgument;
    }
    else {
      *result = (JsValueRef)0x0;
      pJVar3 = Js::JavascriptLibrary::CreateArray
                         ((pSVar1->super_ScriptContextBase).javascriptLibrary,length);
      *result = pJVar3;
      exitStatus = JsNoError;
      if (pSVar1->TTDShouldPerformRecordAction == true) {
        TTD::TTDJsRTActionResultAutoRecorder::SetResult
                  ((TTDJsRTActionResultAutoRecorder *)auStack_38,result);
      }
    }
    AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_58);
  }
  TTD::TTDJsRTActionResultAutoRecorder::CompleteWithStatusCode
            ((TTDJsRTActionResultAutoRecorder *)auStack_38,exitStatus);
  return exitStatus;
}

Assistant:

CHAKRA_API JsCreateArray(_In_ unsigned int length, _Out_ JsValueRef *result)
{
    return ContextAPINoScriptWrapper([&] (Js::ScriptContext *scriptContext, TTDRecorder& _actionEntryPopper) -> JsErrorCode {
        PERFORM_JSRT_TTD_RECORD_ACTION(scriptContext, RecordJsRTAllocateBasicArray, length);

        PARAM_NOT_NULL(result);
        *result = nullptr;

        *result = scriptContext->GetLibrary()->CreateArray(length);

        PERFORM_JSRT_TTD_RECORD_ACTION_RESULT(scriptContext, result);

        return JsNoError;
    });
}